

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void emitblock(aec_stream *strm,int k,int ref)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  byte *pbVar5;
  byte bVar6;
  int in_ECX;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  uint uVar14;
  uint *puVar15;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  
  pbVar5 = *(byte **)(CONCAT44(in_register_00000034,k) + 0x58);
  bVar12 = *pbVar5;
  uVar14 = *(uint *)(CONCAT44(in_register_00000034,k) + 0x168);
  if ((long)in_ECX < (long)((ulong)strm & 0xffffffff)) {
    lVar4 = *(long *)(CONCAT44(in_register_00000034,k) + 0x48);
    puVar2 = (uint *)(lVar4 + ((ulong)strm & 0xffffffff) * 4);
    uVar11 = (ulong)bVar12;
    puVar15 = (uint *)(lVar4 + (long)in_ECX * 4);
    do {
      uVar13 = uVar11 << 0x38;
      uVar14 = (int)uVar14 % 8 + 0x38;
      if (ref < (int)uVar14) {
        do {
          iVar1 = uVar14 - ref;
          uVar3 = *puVar15;
          uVar14 = uVar14 - ref;
          puVar15 = puVar15 + 1;
          uVar13 = ((ulong)(uVar3 & ~(uint)(-1L << ((byte)ref & 0x3f))) << ((byte)iVar1 & 0x3f)) +
                   uVar13;
          if (iVar1 <= ref) break;
        } while (puVar15 < puVar2);
      }
      uVar11 = uVar13 >> 0x38;
      bVar6 = (byte)(uVar13 >> 0x38);
      bVar7 = (byte)(uVar13 >> 0x18);
      bVar8 = (byte)(uVar13 >> 0x20);
      bVar9 = (byte)(uVar13 >> 0x28);
      bVar10 = (byte)(uVar13 >> 0x30);
      bVar12 = (byte)(uVar13 >> 0x10);
      switch(uVar14 >> 3) {
      case 0:
        *pbVar5 = bVar6;
        pbVar5[1] = bVar10;
        pbVar5[2] = bVar9;
        pbVar5[3] = bVar8;
        pbVar5[4] = bVar7;
        pbVar5[5] = bVar12;
        pbVar5[6] = (byte)(uVar13 >> 8);
        pbVar5 = pbVar5 + 7;
        uVar11 = uVar13;
        break;
      case 1:
        *pbVar5 = bVar6;
        pbVar5[1] = bVar10;
        pbVar5[2] = bVar9;
        pbVar5[3] = bVar8;
        pbVar5[4] = bVar7;
        pbVar5[5] = bVar12;
        pbVar5 = pbVar5 + 6;
        uVar11 = uVar13 >> 8;
        break;
      case 2:
        *pbVar5 = bVar6;
        pbVar5[1] = bVar10;
        pbVar5[2] = bVar9;
        pbVar5[3] = bVar8;
        pbVar5[4] = bVar7;
        pbVar5 = pbVar5 + 5;
        uVar11 = uVar13 >> 0x10;
        break;
      case 3:
        *pbVar5 = bVar6;
        pbVar5[1] = bVar10;
        pbVar5[2] = bVar9;
        pbVar5[3] = bVar8;
        pbVar5 = pbVar5 + 4;
        uVar11 = uVar13 >> 0x18;
        break;
      case 4:
        *pbVar5 = bVar6;
        pbVar5[1] = bVar10;
        pbVar5[2] = bVar9;
        pbVar5 = pbVar5 + 3;
        uVar11 = uVar13 >> 0x20;
        break;
      case 5:
        *pbVar5 = bVar6;
        pbVar5[1] = bVar10;
        pbVar5 = pbVar5 + 2;
        uVar11 = uVar13 >> 0x28;
        break;
      case 6:
        *pbVar5 = bVar6;
        pbVar5 = pbVar5 + 1;
        uVar11 = uVar13 >> 0x30;
      }
      bVar12 = (byte)uVar11;
    } while (puVar15 < puVar2);
  }
  *pbVar5 = bVar12;
  *(byte **)(CONCAT44(in_register_00000034,k) + 0x58) = pbVar5;
  *(int *)(CONCAT44(in_register_00000034,k) + 0x168) = (int)uVar14 % 8;
  return;
}

Assistant:

static inline void emitblock(struct aec_stream *strm, int k, int ref)
{
    /**
       Emit the k LSB of a whole block of input data.
    */

    struct internal_state *state = strm->state;
    uint32_t *in = state->block + ref;
    uint32_t *in_end = state->block + strm->block_size;
    uint64_t mask = (UINT64_C(1) << k) - 1;
    uint8_t *o = state->cds;
    uint64_t a = *o;
    int p = state->bits;

    while(in < in_end) {
        a <<= 56;
        p = (p % 8) + 56;

        while (p > k && in < in_end) {
            p -= k;
            a += ((uint64_t)(*in++) & mask) << p;
        }

        switch (p & ~7) {
        case 0:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            o[6] = (uint8_t)(a >> 8);
            o += 7;
            break;
        case 8:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            o[5] = (uint8_t)(a >> 16);
            a >>= 8;
            o += 6;
            break;
        case 16:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            o[4] = (uint8_t)(a >> 24);
            a >>= 16;
            o += 5;
            break;
        case 24:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            o[3] = (uint8_t)(a >> 32);
            a >>= 24;
            o += 4;
            break;
        case 32:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            o[2] = (uint8_t)(a >> 40);
            a >>= 32;
            o += 3;
            break;
        case 40:
            o[0] = (uint8_t)(a >> 56);
            o[1] = (uint8_t)(a >> 48);
            a >>= 40;
            o += 2;
            break;
        case 48:
            *o++ = (uint8_t)(a >> 56);
            a >>= 48;
            break;
        default:
            a >>= 56;
            break;
        }
    }

    *o = (uint8_t)a;
    state->cds = o;
    state->bits = p % 8;
}